

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_MLNodeLinOp.cpp
# Opt level: O0

unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>
amrex::MLNodeLinOp::makeOwnerMask(BoxArray *a_ba,DistributionMapping *dm,Geometry *geom)

{
  MFInfo *factory;
  MultiFab *in_RDX;
  BoxArray *in_RSI;
  _Head_base<0UL,_amrex::iMultiFab_*,_false> in_RDI;
  MultiFab foo;
  BoxArray *ba;
  BoxArray *in_stack_fffffffffffffd00;
  BoxArray *info;
  MFInfo *this;
  Geometry *this_00;
  BoxArray *bxs;
  undefined1 local_280 [16];
  Real RStack_270;
  Real local_268;
  Real RStack_260;
  Real local_258;
  int local_d0 [2];
  int local_c8;
  int local_c0 [2];
  int local_b8;
  BoxArray local_b0;
  BoxArray *local_48;
  MultiFab *local_38;
  int local_20 [2];
  int local_18;
  IntVect local_c;
  
  local_38 = in_RDX;
  IntVect::IntVect(&local_c,1);
  local_18 = local_c.vect[2];
  local_20[0] = local_c.vect[0];
  local_20[1] = local_c.vect[1];
  local_c8 = local_c.vect[2];
  local_d0[0] = local_c.vect[0];
  local_d0[1] = local_c.vect[1];
  local_b8 = local_c.vect[2];
  local_c0[0] = local_c.vect[0];
  local_c0[1] = local_c.vect[1];
  info = &local_b0;
  convert(in_RSI,(IntVect *)in_RDI._M_head_impl);
  local_268 = 0.0;
  RStack_260 = 0.0;
  local_280._8_8_ = 0.0;
  RStack_270 = 0.0;
  local_258 = 0.0;
  this = (MFInfo *)(local_280 + 8);
  bxs = info;
  local_48 = info;
  MFInfo::MFInfo((MFInfo *)0x1681d88);
  factory = MFInfo::SetAlloc(this,false);
  local_280._0_8_ = 0;
  this_00 = (Geometry *)local_280;
  DefaultFabFactory<amrex::FArrayBox>::DefaultFabFactory
            ((DefaultFabFactory<amrex::FArrayBox> *)in_stack_fffffffffffffd00);
  MultiFab::MultiFab(local_38,bxs,(DistributionMapping *)this_00,(int)((ulong)this >> 0x20),
                     (int)this,(MFInfo *)info,(FabFactory<amrex::FArrayBox> *)factory);
  DefaultFabFactory<amrex::FArrayBox>::~DefaultFabFactory
            ((DefaultFabFactory<amrex::FArrayBox> *)0x1681dfa);
  MFInfo::~MFInfo((MFInfo *)0x1681e07);
  Geometry::periodicity(this_00);
  MultiFab::OwnerMask((MultiFab *)this,(Periodicity *)info);
  MultiFab::~MultiFab((MultiFab *)0x1681e55);
  BoxArray::~BoxArray(in_stack_fffffffffffffd00);
  return (__uniq_ptr_data<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>,_true,_true>)
         (tuple<amrex::iMultiFab_*,_std::default_delete<amrex::iMultiFab>_>)in_RDI._M_head_impl;
}

Assistant:

std::unique_ptr<iMultiFab>
MLNodeLinOp::makeOwnerMask (const BoxArray& a_ba, const DistributionMapping& dm,
                            const Geometry& geom)
{
    const BoxArray& ba = amrex::convert(a_ba, IntVect::TheNodeVector());
    MultiFab foo(ba,dm,1,0, MFInfo().SetAlloc(false));
    return foo.OwnerMask(geom.periodicity());
}